

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiColumnData>::reserve(ImVector<ImGuiColumnData> *this,int new_capacity)

{
  ImGuiColumnData *__dest;
  ImGuiColumnData *new_data;
  int new_capacity_local;
  ImVector<ImGuiColumnData> *this_local;
  
  if (this->Capacity < new_capacity) {
    __dest = (ImGuiColumnData *)ImGui::MemAlloc((long)new_capacity << 2);
    if (this->Data != (ImGuiColumnData *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size << 2);
    }
    ImGui::MemFree(this->Data);
    this->Data = __dest;
    this->Capacity = new_capacity;
  }
  return;
}

Assistant:

inline void                 reserve(int new_capacity)
    {
        if (new_capacity <= Capacity) return;
        T* new_data = (value_type*)ImGui::MemAlloc((size_t)new_capacity * sizeof(value_type));
        if (Data)
            memcpy(new_data, Data, (size_t)Size * sizeof(value_type));
        ImGui::MemFree(Data);
        Data = new_data;
        Capacity = new_capacity;
    }